

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_init(nn_ws_handshake *self,int src,nn_fsm *owner)

{
  nn_fsm *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(&self->fsm,(nn_fsm_fn)CONCAT44(src,in_stack_00000008),(nn_fsm_fn)owner,
              (int)((ulong)in_RDI >> 0x20),(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX
             );
  *(undefined4 *)(in_RDI + 0x58) = 1;
  nn_timer_init((nn_timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                (nn_fsm *)0x31285a);
  nn_fsm_event_init((nn_fsm_event *)0x31286b);
  *(undefined4 *)(in_RDI + 0x148) = 5000;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined4 *)(in_RDI + 0x158) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  return;
}

Assistant:

void nn_ws_handshake_init (struct nn_ws_handshake *self, int src,
    struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_ws_handshake_handler, nn_ws_handshake_shutdown,
        src, self, owner);
    self->state = NN_WS_HANDSHAKE_STATE_IDLE;
    nn_timer_init (&self->timer, NN_WS_HANDSHAKE_SRC_TIMER, &self->fsm);
    nn_fsm_event_init (&self->done);
    self->timeout = NN_WS_HANDSHAKE_TIMEOUT;
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    self->pipebase = NULL;
}